

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_write_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end,size_t *out_len)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ushort *local_50;
  uint16_t *sig_alg;
  size_t supported_sig_alg_len;
  uchar *supported_sig_alg;
  uchar *p;
  size_t *out_len_local;
  uchar *end_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  *out_len = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x2440,"adding signature_algorithms extension");
  iVar2 = mbedtls_ssl_chk_buf_ptr(buf,end,6);
  if (iVar2 == 0) {
    local_50 = (ushort *)mbedtls_ssl_get_sig_algs(ssl);
    supported_sig_alg = buf + 6;
    if (local_50 == (ushort *)0x0) {
      ssl_local._4_4_ = -0x5e80;
    }
    else {
      for (; *local_50 != 0; local_50 = local_50 + 1) {
        uVar1 = *local_50;
        pcVar3 = mbedtls_ssl_sig_alg_to_str(*local_50);
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x2456,"got signature scheme [%x] %s",(ulong)uVar1,pcVar3);
        iVar2 = mbedtls_ssl_sig_alg_is_supported(ssl,*local_50);
        if (iVar2 != 0) {
          iVar2 = mbedtls_ssl_chk_buf_ptr(supported_sig_alg,end,2);
          if (iVar2 != 0) {
            return -0x6a00;
          }
          mbedtls_put_unaligned_uint16(supported_sig_alg,*local_50 << 8 | *local_50 >> 8);
          supported_sig_alg = supported_sig_alg + 2;
          uVar1 = *local_50;
          pcVar3 = mbedtls_ssl_sig_alg_to_str(*local_50);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x245f,"sent signature scheme [%x] %s",(ulong)uVar1,pcVar3);
        }
      }
      lVar4 = (long)supported_sig_alg - (long)(buf + 6);
      if (lVar4 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x2465,"No signature algorithms defined.");
        ssl_local._4_4_ = -0x6c00;
      }
      else {
        mbedtls_put_unaligned_uint16(buf,0xd00);
        uVar1 = (ushort)lVar4;
        mbedtls_put_unaligned_uint16(buf + 2,(uVar1 + 2) * 0x100 | (ushort)(uVar1 + 2) >> 8);
        mbedtls_put_unaligned_uint16(buf + 4,uVar1 << 8 | uVar1 >> 8);
        *out_len = (long)supported_sig_alg - (long)buf;
        ssl_local._4_4_ = 0;
      }
    }
  }
  else {
    ssl_local._4_4_ = -0x6a00;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_write_sig_alg_ext(mbedtls_ssl_context *ssl, unsigned char *buf,
                                  const unsigned char *end, size_t *out_len)
{
    unsigned char *p = buf;
    unsigned char *supported_sig_alg; /* Start of supported_signature_algorithms */
    size_t supported_sig_alg_len = 0; /* Length of supported_signature_algorithms */

    *out_len = 0;

    MBEDTLS_SSL_DEBUG_MSG(3, ("adding signature_algorithms extension"));

    /* Check if we have space for header and length field:
     * - extension_type         (2 bytes)
     * - extension_data_length  (2 bytes)
     * - supported_signature_algorithms_length   (2 bytes)
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 6);
    p += 6;

    /*
     * Write supported_signature_algorithms
     */
    supported_sig_alg = p;
    const uint16_t *sig_alg = mbedtls_ssl_get_sig_algs(ssl);
    if (sig_alg == NULL) {
        return MBEDTLS_ERR_SSL_BAD_CONFIG;
    }

    for (; *sig_alg != MBEDTLS_TLS1_3_SIG_NONE; sig_alg++) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("got signature scheme [%x] %s",
                                  *sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(*sig_alg)));
        if (!mbedtls_ssl_sig_alg_is_supported(ssl, *sig_alg)) {
            continue;
        }
        MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
        MBEDTLS_PUT_UINT16_BE(*sig_alg, p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(3, ("sent signature scheme [%x] %s",
                                  *sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(*sig_alg)));
    }

    /* Length of supported_signature_algorithms */
    supported_sig_alg_len = p - supported_sig_alg;
    if (supported_sig_alg_len == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("No signature algorithms defined."));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_SIG_ALG, buf, 0);
    MBEDTLS_PUT_UINT16_BE(supported_sig_alg_len + 2, buf, 2);
    MBEDTLS_PUT_UINT16_BE(supported_sig_alg_len, buf, 4);

    *out_len = p - buf;

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    mbedtls_ssl_tls13_set_hs_sent_ext_mask(ssl, MBEDTLS_TLS_EXT_SIG_ALG);
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    return 0;
}